

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

char * __thiscall QMetaEnum::key(QMetaEnum *this,int index)

{
  QMetaObject *pQVar1;
  uint *puVar2;
  uint *puVar3;
  
  pQVar1 = this->mobj;
  if ((-1 < index && pQVar1 != (QMetaObject *)0x0) &&
     (puVar2 = (this->data).d, index < (int)puVar2[3])) {
    puVar3 = (pQVar1->d).stringdata;
    return (char *)((ulong)puVar3[(long)(int)(pQVar1->d).data[index * 2 + puVar2[4]] * 2] +
                   (long)puVar3);
  }
  return (char *)0x0;
}

Assistant:

const char *QMetaEnum::key(int index) const
{
    if (!mobj)
        return nullptr;
    if (index >= 0  && index < int(data.keyCount()))
        return rawStringData(mobj, mobj->d.data[data.data() + 2*index]);
    return nullptr;
}